

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_mobj.cpp
# Opt level: O0

int AF_AActor_SpawnBlood
              (VMValue *param,TArray<VMValue,_VMValue> *defaultparam,int numparam,VMReturn *ret,
              int numret)

{
  double a;
  double b;
  AActor *originator;
  bool bVar1;
  bool local_83;
  TAngle<double> local_80;
  TVector3<double> local_78;
  int local_5c;
  int damage;
  DAngle dir;
  double z;
  double y;
  double x;
  AActor *self;
  int paramnum;
  int numret_local;
  VMReturn *ret_local;
  int numparam_local;
  TArray<VMValue,_VMValue> *defaultparam_local;
  VMValue *param_local;
  
  if (numparam < 1) {
    __assert_fail("(paramnum) < numparam",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_mobj.cpp"
                  ,0x16d2,
                  "int AF_AActor_SpawnBlood(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
  }
  bVar1 = false;
  if (((param->field_0).field_3.Type == '\x03') &&
     (bVar1 = true, (param->field_0).field_1.atag != 1)) {
    bVar1 = (param->field_0).field_1.a == (void *)0x0;
  }
  if (!bVar1) {
    __assert_fail("param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_mobj.cpp"
                  ,0x16d2,
                  "int AF_AActor_SpawnBlood(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
  }
  originator = (AActor *)(param->field_0).field_1.a;
  local_83 = true;
  if (originator != (AActor *)0x0) {
    local_83 = DObject::IsKindOf((DObject *)originator,AActor::RegistrationInfo.MyClass);
  }
  if (local_83 == false) {
    __assert_fail("self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_mobj.cpp"
                  ,0x16d2,
                  "int AF_AActor_SpawnBlood(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
  }
  if (numparam < 2) {
    __assert_fail("(paramnum) < numparam",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_mobj.cpp"
                  ,0x16d3,
                  "int AF_AActor_SpawnBlood(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
  }
  if (param[1].field_0.field_3.Type != '\x01') {
    __assert_fail("param[paramnum].Type == REGT_FLOAT",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_mobj.cpp"
                  ,0x16d3,
                  "int AF_AActor_SpawnBlood(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
  }
  a = param[1].field_0.f;
  if (numparam < 3) {
    __assert_fail("(paramnum) < numparam",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_mobj.cpp"
                  ,0x16d4,
                  "int AF_AActor_SpawnBlood(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
  }
  if (param[2].field_0.field_3.Type != '\x01') {
    __assert_fail("param[paramnum].Type == REGT_FLOAT",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_mobj.cpp"
                  ,0x16d4,
                  "int AF_AActor_SpawnBlood(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
  }
  b = param[2].field_0.f;
  if (numparam < 4) {
    __assert_fail("(paramnum) < numparam",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_mobj.cpp"
                  ,0x16d5,
                  "int AF_AActor_SpawnBlood(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
  }
  if (param[3].field_0.field_3.Type != '\x01') {
    __assert_fail("param[paramnum].Type == REGT_FLOAT",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_mobj.cpp"
                  ,0x16d5,
                  "int AF_AActor_SpawnBlood(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
  }
  dir.Degrees = *(double *)&param[3].field_0;
  if (numparam < 5) {
    __assert_fail("(paramnum) < numparam",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_mobj.cpp"
                  ,0x16d6,
                  "int AF_AActor_SpawnBlood(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
  }
  if (param[4].field_0.field_3.Type != '\x01') {
    __assert_fail("param[paramnum].Type == REGT_FLOAT",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_mobj.cpp"
                  ,0x16d6,
                  "int AF_AActor_SpawnBlood(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
  }
  TAngle<double>::TAngle((TAngle<double> *)&stack0xffffffffffffffa8,param[4].field_0.f);
  if (numparam < 6) {
    __assert_fail("(paramnum) < numparam",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_mobj.cpp"
                  ,0x16d7,
                  "int AF_AActor_SpawnBlood(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
  }
  if (param[5].field_0.field_3.Type != '\0') {
    __assert_fail("param[paramnum].Type == REGT_INT",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_mobj.cpp"
                  ,0x16d7,
                  "int AF_AActor_SpawnBlood(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
  }
  local_5c = param[5].field_0.i;
  TVector3<double>::TVector3(&local_78,a,b,dir.Degrees);
  TAngle<double>::TAngle(&local_80,(TAngle<double> *)&stack0xffffffffffffffa8);
  P_SpawnBlood(&local_78,&local_80,local_5c,originator);
  return 0;
}

Assistant:

DEFINE_ACTION_FUNCTION(AActor, SpawnBlood)
{
	PARAM_SELF_PROLOGUE(AActor);
	PARAM_FLOAT(x);
	PARAM_FLOAT(y);
	PARAM_FLOAT(z);
	PARAM_ANGLE(dir);
	PARAM_INT(damage);
	P_SpawnBlood(DVector3(x, y, z), dir, damage, self);
	return 0;
}